

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

__pid_t __thiscall hwnet::util::TimerRoutine::wait(TimerRoutine *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  Ptr *pPVar1;
  element_type *peVar2;
  duration<long,_std::ratio<1L,_1000L>_> local_60;
  duration<unsigned_long,_std::ratio<1L,_1000L>_> local_58;
  undefined1 local_50 [8];
  Ptr top;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  duration<unsigned_long,_std::ratio<1L,_1000L>_> local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  milliseconds now_local;
  TimerRoutine *this_local;
  
  guard._M_device = (mutex_type *)__stat_loc;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&(this->mgr).mtx);
  if ((this->mgr).elements_size == 0) {
    this->waitting = true;
    this->waitTime = 0xffffffff;
    local_30.__r = (rep)ms<(char)49>();
    local_28 = std::chrono::operator*(&this->waitTime,&local_30);
    std::_V2::condition_variable_any::wait_for<std::mutex,unsigned_long,std::ratio<1l,1000l>>
              (&this->cv,&(this->mgr).mtx,&local_28);
  }
  else {
    pPVar1 = TimerMgr::top(&this->mgr);
    std::shared_ptr<hwnet::util::Timer>::shared_ptr
              ((shared_ptr<hwnet::util::Timer> *)local_50,pPVar1);
    peVar2 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    if (guard._M_device < (mutex_type *)peVar2->mExpiredTime) {
      this->waitting = true;
      peVar2 = std::
               __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      this->waitTime = peVar2->mExpiredTime - (long)guard._M_device;
      local_60.__r = (rep)ms<(char)49>();
      local_58 = std::chrono::operator*(&this->waitTime,&local_60);
      std::_V2::condition_variable_any::wait_for<std::mutex,unsigned_long,std::ratio<1l,1000l>>
                (&this->cv,&(this->mgr).mtx,&local_58);
    }
    std::shared_ptr<hwnet::util::Timer>::~shared_ptr((shared_ptr<hwnet::util::Timer> *)local_50);
  }
  this->waitting = false;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return extraout_EAX;
}

Assistant:

void TimerRoutine::wait(milliseconds now) {
	std::lock_guard<std::mutex> guard(this->mgr.mtx);
	if(this->mgr.elements_size == 0) {
		this->waitting = true;
		this->waitTime = 0xFFFFFFFF;
		this->cv.wait_for(this->mgr.mtx,this->waitTime * 1ms);
	} else {
		auto top = this->mgr.top();
		if(top->mExpiredTime > now) {
			this->waitting = true;
			this->waitTime = top->mExpiredTime - now;
			this->cv.wait_for(this->mgr.mtx,this->waitTime * 1ms);			
		}
	}
	this->waitting = false;
}